

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

QGraphicsAnchor * __thiscall
QGraphicsAnchorLayoutPrivate::addAnchor
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *firstItem,AnchorPoint firstEdge,
          QGraphicsLayoutItem *secondItem,AnchorPoint secondEdge,qreal *spacing)

{
  long lVar1;
  long *plVar2;
  QGraphicsLayoutItem *this_00;
  long lVar3;
  AnchorPoint AVar4;
  QGraphicsLayoutItem *pQVar5;
  AnchorData *data;
  QGraphicsAnchor *this_01;
  long lVar6;
  AnchorPoint firstEdge_00;
  ulong uVar7;
  QGraphicsLayoutItem *pQVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  QGraphicsLayoutItem *local_48;
  
  if ((firstItem == (QGraphicsLayoutItem *)0x0) || (secondItem == (QGraphicsLayoutItem *)0x0)) {
    addAnchor();
    return (QGraphicsAnchor *)0x0;
  }
  if (firstItem == secondItem) {
    addAnchor();
    return (QGraphicsAnchor *)0x0;
  }
  uVar7 = (ulong)secondEdge;
  if (2 < (int)firstEdge == (int)secondEdge < 3) {
    addAnchor();
    return (QGraphicsAnchor *)0x0;
  }
  this_00 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  pQVar5 = QGraphicsLayoutItem::parentLayoutItem(this_00);
  if ((pQVar5 == firstItem) || (pQVar5 == secondItem)) {
    addAnchor();
    return (QGraphicsAnchor *)0x0;
  }
  if (this_00 != firstItem) {
    lVar3 = (this->items).d.size;
    if (lVar3 != 0) {
      lVar6 = 0;
      do {
        if (lVar3 << 3 == lVar6) goto LAB_005c0022;
        lVar1 = lVar6 + 8;
        plVar2 = (long *)((long)(this->items).d.ptr + lVar6);
        lVar6 = lVar1;
      } while ((QGraphicsLayoutItem *)*plVar2 != firstItem);
      if (lVar1 != 0) goto LAB_005c0038;
    }
LAB_005c0022:
    createItemEdges(this,firstItem);
    QGraphicsLayoutPrivate::addChildLayoutItem(&this->super_QGraphicsLayoutPrivate,firstItem);
  }
LAB_005c0038:
  if (this_00 != secondItem) {
    lVar3 = (this->items).d.size;
    if (lVar3 != 0) {
      lVar6 = 0;
      do {
        if (lVar3 << 3 == lVar6) goto LAB_005c006f;
        lVar1 = lVar6 + 8;
        plVar2 = (long *)((long)(this->items).d.ptr + lVar6);
        lVar6 = lVar1;
      } while ((QGraphicsLayoutItem *)*plVar2 != secondItem);
      if (lVar1 != 0) goto LAB_005c0085;
    }
LAB_005c006f:
    createItemEdges(this,secondItem);
    QGraphicsLayoutPrivate::addChildLayoutItem(&this->super_QGraphicsLayoutPrivate,secondItem);
  }
LAB_005c0085:
  createCenterAnchors(this,firstItem,firstEdge);
  createCenterAnchors(this,secondItem,secondEdge);
  pQVar5 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  pQVar8 = firstItem;
  local_48 = secondItem;
  if (pQVar5 == secondItem || pQVar5 == firstItem) {
    if (pQVar5 == firstItem) {
      if ((firstEdge == AnchorRight) || (firstEdge == AnchorBottom)) goto LAB_005c00f4;
    }
    else if ((secondEdge != AnchorRight) && (secondEdge != AnchorBottom)) goto LAB_005c00f4;
  }
  else if ((int)firstEdge < (int)secondEdge) goto LAB_005c00f4;
  uVar7 = (ulong)firstEdge;
  pQVar8 = secondItem;
  firstEdge = secondEdge;
  local_48 = firstItem;
LAB_005c00f4:
  data = (AnchorData *)operator_new(0x80);
  (data->super_QSimplexVariable).result = 0.0;
  (data->super_QSimplexVariable).index = 0;
  data->_vptr_AnchorData = (_func_int **)&PTR__AnchorData_00811180;
  data->from = (AnchorVertex *)0x0;
  data->to = (AnchorVertex *)0x0;
  data->minSize = 0.0;
  data->prefSize = 0.0;
  data->maxSize = 0.0;
  data->minPrefSize = 0.0;
  data->maxPrefSize = 0.0;
  data->sizeAtMinimum = 0.0;
  data->sizeAtPreferred = 0.0;
  data->sizeAtMaximum = 0.0;
  data->item = (QGraphicsLayoutItem *)0x0;
  data->graphicsAnchor = (QGraphicsAnchor *)0x0;
  data->field_0x78 = 0;
  this_01 = (QGraphicsAnchor *)acquireGraphicsAnchor(this,data);
  firstEdge_00 = (AnchorPoint)uVar7;
  addAnchor_helper(this,local_48,firstEdge_00,pQVar8,firstEdge,data);
  if (spacing == (qreal *)0x0) {
    if (pQVar8 != this_00 && local_48 != this_00) {
      AVar4 = firstEdge_00 - AnchorTop;
      if ((int)firstEdge_00 < 3) {
        AVar4 = firstEdge_00;
      }
      if (AVar4 != AnchorHorizontalCenter) {
        if ((firstEdge_00 < (AnchorVerticalCenter|AnchorRight)) &&
           ((0x2dU >> (firstEdge_00 & 0x1f) & 1) != 0)) {
          firstEdge_00 = *(AnchorPoint *)(&DAT_006f1140 + uVar7 * 4);
        }
        if (firstEdge_00 == firstEdge) {
          QGraphicsAnchor::unsetSpacing(this_01);
          return (QGraphicsAnchor *)this_01;
        }
      }
    }
    uVar9 = 0;
    uVar10 = 0;
  }
  else {
    uVar9 = SUB84(*spacing,0);
    uVar10 = (undefined4)((ulong)*spacing >> 0x20);
  }
  QGraphicsAnchor::setSpacing(this_01,(qreal)CONCAT44(uVar10,uVar9));
  return (QGraphicsAnchor *)this_01;
}

Assistant:

QGraphicsAnchor *QGraphicsAnchorLayoutPrivate::addAnchor(QGraphicsLayoutItem *firstItem,
                                                         Qt::AnchorPoint firstEdge,
                                                         QGraphicsLayoutItem *secondItem,
                                                         Qt::AnchorPoint secondEdge,
                                                         qreal *spacing)
{
    Q_Q(QGraphicsAnchorLayout);
    if ((firstItem == nullptr) || (secondItem == nullptr)) {
        qWarning("QGraphicsAnchorLayout::addAnchor(): "
                 "Cannot anchor NULL items");
        return nullptr;
    }

    if (firstItem == secondItem) {
        qWarning("QGraphicsAnchorLayout::addAnchor(): "
                 "Cannot anchor the item to itself");
        return nullptr;
    }

    if (edgeOrientation(secondEdge) != edgeOrientation(firstEdge)) {
        qWarning("QGraphicsAnchorLayout::addAnchor(): "
                 "Cannot anchor edges of different orientations");
        return nullptr;
    }

    const QGraphicsLayoutItem *parentWidget = q->parentLayoutItem();
    if (firstItem == parentWidget || secondItem == parentWidget) {
        qWarning("QGraphicsAnchorLayout::addAnchor(): "
                 "You cannot add the parent of the layout to the layout.");
        return nullptr;
    }

    // In QGraphicsAnchorLayout, items are represented in its internal
    // graph as four anchors that connect:
    //  - Left -> HCenter
    //  - HCenter-> Right
    //  - Top -> VCenter
    //  - VCenter -> Bottom

    // Ensure that the internal anchors have been created for both items.
    if (firstItem != q && !items.contains(firstItem)) {
        createItemEdges(firstItem);
        addChildLayoutItem(firstItem);
    }
    if (secondItem != q && !items.contains(secondItem)) {
        createItemEdges(secondItem);
        addChildLayoutItem(secondItem);
    }

    // Create center edges if needed
    createCenterAnchors(firstItem, firstEdge);
    createCenterAnchors(secondItem, secondEdge);

    // Use heuristics to find out what the user meant with this anchor.
    correctEdgeDirection(firstItem, firstEdge, secondItem, secondEdge);

    AnchorData *data = new AnchorData;
    QGraphicsAnchor *graphicsAnchor = acquireGraphicsAnchor(data);

    addAnchor_helper(firstItem, firstEdge, secondItem, secondEdge, data);

    if (spacing) {
        graphicsAnchor->setSpacing(*spacing);
    } else {
        // If firstItem or secondItem is the layout itself, the spacing will default to 0.
        // Otherwise, the following matrix is used (questionmark means that the spacing
        // is queried from the style):
        //                from
        //  to      Left    HCenter Right
        //  Left    0       0       ?
        //  HCenter 0       0       0
        //  Right   ?       0       0
        if (firstItem == q
            || secondItem == q
            || pickEdge(firstEdge, Qt::Horizontal) == Qt::AnchorHorizontalCenter
            || oppositeEdge(firstEdge) != secondEdge) {
            graphicsAnchor->setSpacing(0);
        } else {
            graphicsAnchor->unsetSpacing();
        }
    }

    return graphicsAnchor;
}